

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

void file_opendir_cb(uv_fs_t *req)

{
  char *__s1;
  int iVar1;
  undefined8 uVar2;
  uv_fs_t *unaff_RBX;
  uv_fs_t *puVar3;
  long lVar4;
  undefined1 auStack_8e0 [440];
  uv_fs_t *puStack_728;
  undefined1 auStack_718 [440];
  uv_fs_t uStack_560;
  undefined1 auStack_3a8 [440];
  undefined1 auStack_1f0 [440];
  
  if (req == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015aad8;
    if (opendir_req.result != -0x14) goto LAB_0015aadd;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_0015aad8:
    file_opendir_cb_cold_2();
LAB_0015aadd:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_728 = (uv_fs_t *)0x15aafd;
  cleanup_test_files();
  puStack_728 = (uv_fs_t *)0x15ab02;
  uVar2 = uv_default_loop();
  puStack_728 = (uv_fs_t *)0x15ab21;
  iVar1 = uv_fs_mkdir(uVar2,auStack_3a8,"test_dir",0x1ed,0);
  if (iVar1 == 0) {
    puStack_728 = (uv_fs_t *)0x15ab2e;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15ab53;
    iVar1 = uv_fs_open(uVar2,&uStack_560,"test_dir/file1",0x41,0x180,0);
    puVar3 = unaff_RBX;
    if (iVar1 < 0) goto LAB_0015aef9;
    puVar3 = &uStack_560;
    puStack_728 = (uv_fs_t *)0x15ab6b;
    uv_fs_req_cleanup(puVar3);
    puStack_728 = (uv_fs_t *)0x15ab70;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15ab82;
    iVar1 = uv_fs_close(uVar2,auStack_718,(undefined4)uStack_560.result,0);
    if (iVar1 != 0) goto LAB_0015aefe;
    puStack_728 = (uv_fs_t *)0x15ab94;
    uv_fs_req_cleanup(auStack_718);
    puStack_728 = (uv_fs_t *)0x15ab99;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15abbe;
    iVar1 = uv_fs_open(uVar2,&uStack_560,"test_dir/file2",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_0015af03;
    puVar3 = &uStack_560;
    puStack_728 = (uv_fs_t *)0x15abd6;
    uv_fs_req_cleanup(puVar3);
    puStack_728 = (uv_fs_t *)0x15abdb;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15abed;
    iVar1 = uv_fs_close(uVar2,auStack_718,(undefined4)uStack_560.result,0);
    if (iVar1 != 0) goto LAB_0015af08;
    puStack_728 = (uv_fs_t *)0x15abff;
    uv_fs_req_cleanup(auStack_718);
    puStack_728 = (uv_fs_t *)0x15ac04;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15ac23;
    iVar1 = uv_fs_mkdir(uVar2,auStack_3a8,"test_dir/test_subdir",0x1ed,0);
    if (iVar1 != 0) goto LAB_0015af0d;
    puStack_728 = (uv_fs_t *)0x15ac38;
    uv_fs_req_cleanup(auStack_3a8);
    puVar3 = &opendir_req;
    puStack_728 = (uv_fs_t *)0x15ac51;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_728 = (uv_fs_t *)0x15ac56;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15ac6a;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",0);
    unaff_RBX = (uv_fs_t *)opendir_req.ptr;
    if (iVar1 != 0) goto LAB_0015af12;
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015af17;
    if (opendir_req.result != 0) goto LAB_0015af1c;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0015af21;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)unaff_RBX + 8) = 1;
    puStack_728 = (uv_fs_t *)0x15acbb;
    uv_fs_req_cleanup(&opendir_req);
    puStack_728 = (uv_fs_t *)0x15acc0;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15acd4;
    iVar1 = uv_fs_readdir(uVar2,&readdir_req,unaff_RBX,0);
    if (iVar1 == 0) {
LAB_0015aeef:
      puStack_728 = (uv_fs_t *)0x15aef4;
      run_test_fs_readdir_non_empty_dir_cold_21();
      goto LAB_0015aef4;
    }
    lVar4 = 3;
    do {
      __s1 = dirents[0].name;
      puStack_728 = (uv_fs_t *)0x15ad09;
      iVar1 = strcmp(dirents[0].name,"file1");
      if (iVar1 != 0) {
        puStack_728 = (uv_fs_t *)0x15ad1c;
        iVar1 = strcmp(__s1,"file2");
        if (iVar1 == 0) goto LAB_0015ad33;
        puStack_728 = (uv_fs_t *)0x15ad2b;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) goto LAB_0015ad33;
LAB_0015aee5:
        puStack_728 = (uv_fs_t *)0x15aeea;
        run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0015aeea:
        puStack_728 = (uv_fs_t *)0x15aeef;
        run_test_fs_readdir_non_empty_dir_cold_12();
        goto LAB_0015aeef;
      }
LAB_0015ad33:
      puStack_728 = (uv_fs_t *)0x15ad3e;
      iVar1 = strcmp(__s1,"test_subdir");
      if (iVar1 == 0) {
        if (dirents[0].type == UV_DIRENT_DIR) goto LAB_0015ad5b;
        goto LAB_0015aeea;
      }
      if (dirents[0].type != UV_DIRENT_FILE) {
        puStack_728 = (uv_fs_t *)0x15aee5;
        run_test_fs_readdir_non_empty_dir_cold_11();
        goto LAB_0015aee5;
      }
LAB_0015ad5b:
      puStack_728 = (uv_fs_t *)0x15ad63;
      uv_fs_req_cleanup(&readdir_req);
      puStack_728 = (uv_fs_t *)0x15ad68;
      uVar2 = uv_default_loop();
      puStack_728 = (uv_fs_t *)0x15ad78;
      iVar1 = uv_fs_readdir(uVar2,&readdir_req,unaff_RBX,0);
      lVar4 = lVar4 + -1;
    } while (iVar1 != 0);
    if (lVar4 != 0) goto LAB_0015aeef;
    puStack_728 = (uv_fs_t *)0x15ad98;
    uv_fs_req_cleanup(&readdir_req);
    puStack_728 = (uv_fs_t *)0x15adb1;
    memset(&closedir_req,0xdb,0x1b8);
    puStack_728 = (uv_fs_t *)0x15adb6;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15adc6;
    uv_fs_closedir(uVar2,&closedir_req,unaff_RBX,0);
    if (closedir_req.result != 0) goto LAB_0015af26;
    puStack_728 = (uv_fs_t *)0x15ade0;
    uv_fs_req_cleanup(&closedir_req);
    unaff_RBX = &opendir_req;
    puStack_728 = (uv_fs_t *)0x15adf9;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_728 = (uv_fs_t *)0x15adfe;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15ae17;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    if (iVar1 != 0) goto LAB_0015af2b;
    if (non_empty_opendir_cb_count != 0) goto LAB_0015af30;
    if (non_empty_closedir_cb_count != 0) goto LAB_0015af35;
    puStack_728 = (uv_fs_t *)0x15ae3e;
    uVar2 = uv_default_loop();
    puStack_728 = (uv_fs_t *)0x15ae48;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0015af3a;
    if (non_empty_opendir_cb_count != 1) goto LAB_0015af3f;
    if (non_empty_closedir_cb_count == 1) {
      puStack_728 = (uv_fs_t *)0x15ae6f;
      uVar2 = uv_default_loop();
      puStack_728 = (uv_fs_t *)0x15ae8b;
      uv_fs_rmdir(uVar2,auStack_1f0,"test_subdir",0);
      puStack_728 = (uv_fs_t *)0x15ae93;
      uv_fs_req_cleanup(auStack_1f0);
      puStack_728 = (uv_fs_t *)0x15ae98;
      cleanup_test_files();
      puStack_728 = (uv_fs_t *)0x15ae9d;
      unaff_RBX = (uv_fs_t *)uv_default_loop();
      puStack_728 = (uv_fs_t *)0x15aeb1;
      uv_walk(unaff_RBX,close_walk_cb,0);
      puStack_728 = (uv_fs_t *)0x15aebb;
      uv_run(unaff_RBX,0);
      puStack_728 = (uv_fs_t *)0x15aec0;
      uVar2 = uv_default_loop();
      puStack_728 = (uv_fs_t *)0x15aec8;
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0015af49;
    }
  }
  else {
LAB_0015aef4:
    puStack_728 = (uv_fs_t *)0x15aef9;
    run_test_fs_readdir_non_empty_dir_cold_1();
    puVar3 = unaff_RBX;
LAB_0015aef9:
    puStack_728 = (uv_fs_t *)0x15aefe;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_0015aefe:
    puStack_728 = (uv_fs_t *)0x15af03;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0015af03:
    puStack_728 = (uv_fs_t *)0x15af08;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_0015af08:
    puStack_728 = (uv_fs_t *)0x15af0d;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_0015af0d:
    puStack_728 = (uv_fs_t *)0x15af12;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0015af12:
    puStack_728 = (uv_fs_t *)0x15af17;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0015af17:
    puStack_728 = (uv_fs_t *)0x15af1c;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_0015af1c:
    unaff_RBX = puVar3;
    puStack_728 = (uv_fs_t *)0x15af21;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_0015af21:
    puStack_728 = (uv_fs_t *)0x15af26;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_0015af26:
    puStack_728 = (uv_fs_t *)0x15af2b;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_0015af2b:
    puStack_728 = (uv_fs_t *)0x15af30;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_0015af30:
    puStack_728 = (uv_fs_t *)0x15af35;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_0015af35:
    puStack_728 = (uv_fs_t *)0x15af3a;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_0015af3a:
    puStack_728 = (uv_fs_t *)0x15af3f;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_0015af3f:
    puStack_728 = (uv_fs_t *)0x15af44;
    run_test_fs_readdir_non_empty_dir_cold_18();
  }
  puStack_728 = (uv_fs_t *)0x15af49;
  run_test_fs_readdir_non_empty_dir_cold_19();
LAB_0015af49:
  puStack_728 = (uv_fs_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_20();
  puStack_728 = unaff_RBX;
  uv_fs_unlink(0,auStack_8e0,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_8e0);
  uv_fs_unlink(0,auStack_8e0,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_8e0);
  uv_fs_rmdir(0,auStack_8e0,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_8e0);
  uv_fs_rmdir(0,auStack_8e0,"test_dir",0);
  uv_fs_req_cleanup(auStack_8e0);
  return;
}

Assistant:

static void file_opendir_cb(uv_fs_t* req) {
  ASSERT(req == &opendir_req);
  ASSERT(req->fs_type == UV_FS_OPENDIR);
  ASSERT(req->result == UV_ENOTDIR);
  ASSERT(req->ptr == NULL);

  uv_fs_req_cleanup(req);
  ++file_opendir_cb_count;
}